

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool __thiscall ImGuiListClipper::Step(ImGuiListClipper *this)

{
  float fVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiTable *table_00;
  bool bVar4;
  int already_submitted;
  float pos_y2;
  float pos_y1;
  ImGuiTable *table;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiListClipper *this_local;
  
  pIVar3 = GImGui->CurrentWindow;
  table_00 = GImGui->CurrentTable;
  if ((table_00 != (ImGuiTable *)0x0) && ((table_00->IsInsideRow & 1U) != 0)) {
    ImGui::TableEndRow(table_00);
  }
  if ((this->ItemsCount == 0) || (bVar4 = GetSkipItemForListClipping(), bVar4)) {
    End(this);
    return false;
  }
  if (this->StepNo == 0) {
    if ((table_00 != (ImGuiTable *)0x0) && ((table_00->IsUnfrozenRows & 1U) == 0)) {
      this->DisplayStart = this->ItemsFrozen;
      this->DisplayEnd = this->ItemsFrozen + 1;
      this->ItemsFrozen = this->ItemsFrozen + 1;
      return true;
    }
    this->StartPosY = (pIVar3->DC).CursorPos.y;
    if (this->ItemsHeight <= 0.0) {
      this->DisplayStart = this->ItemsFrozen;
      this->DisplayEnd = this->ItemsFrozen + 1;
      this->StepNo = 1;
      return true;
    }
    this->DisplayStart = this->DisplayEnd;
    this->StepNo = 2;
  }
  if (this->StepNo == 1) {
    if (0.0 < this->ItemsHeight) {
      __assert_fail("ItemsHeight <= 0.0f",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x987,"bool ImGuiListClipper::Step()");
    }
    if (table_00 == (ImGuiTable *)0x0) {
      this->ItemsHeight = (pIVar3->DC).CursorPos.y - this->StartPosY;
    }
    else {
      fVar1 = table_00->RowPosY2;
      this->ItemsHeight = fVar1 - table_00->RowPosY1;
      (pIVar3->DC).CursorPos.y = fVar1;
    }
    if (this->ItemsHeight <= 0.0) {
      __assert_fail("ItemsHeight > 0.0f && \"Unable to calculate item height! First item hasn\'t moved the cursor vertically!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x993,"bool ImGuiListClipper::Step()");
    }
    this->StepNo = 2;
  }
  if (this->DisplayEnd < this->ItemsCount) {
    if (this->StepNo == 2) {
      if (this->ItemsHeight <= 0.0) {
        __assert_fail("ItemsHeight > 0.0f",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x9a1,"bool ImGuiListClipper::Step()");
      }
      iVar2 = this->DisplayEnd;
      ImGui::CalcListClipping
                (this->ItemsCount - iVar2,this->ItemsHeight,&this->DisplayStart,&this->DisplayEnd);
      this->DisplayStart = iVar2 + this->DisplayStart;
      this->DisplayEnd = iVar2 + this->DisplayEnd;
      if (iVar2 < this->DisplayStart) {
        SetCursorPosYAndSetupForPrevLine
                  ((float)(this->DisplayStart - this->ItemsFrozen) * this->ItemsHeight +
                   this->StartPosY,this->ItemsHeight);
      }
      this->StepNo = 3;
      this_local._7_1_ = true;
    }
    else {
      if (this->StepNo != 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x9bb,"bool ImGuiListClipper::Step()");
      }
      if (this->ItemsCount < 0x7fffffff) {
        SetCursorPosYAndSetupForPrevLine
                  ((float)(this->ItemsCount - this->ItemsFrozen) * this->ItemsHeight +
                   this->StartPosY,this->ItemsHeight);
      }
      this->ItemsCount = -1;
      this_local._7_1_ = false;
    }
  }
  else {
    End(this);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ImGuiListClipper::Step()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImGuiTable* table = g.CurrentTable;
    if (table && table->IsInsideRow)
        ImGui::TableEndRow(table);

    // No items
    if (ItemsCount == 0 || GetSkipItemForListClipping())
    {
        End();
        return false;
    }

    // Step 0: Let you process the first element (regardless of it being visible or not, so we can measure the element height)
    if (StepNo == 0)
    {
        // While we are in frozen row state, keep displaying items one by one, unclipped
        // FIXME: Could be stored as a table-agnostic state.
        if (table != NULL && !table->IsUnfrozenRows)
        {
            DisplayStart = ItemsFrozen;
            DisplayEnd = ItemsFrozen + 1;
            ItemsFrozen++;
            return true;
        }

        StartPosY = window->DC.CursorPos.y;
        if (ItemsHeight <= 0.0f)
        {
            // Submit the first item so we can measure its height (generally it is 0..1)
            DisplayStart = ItemsFrozen;
            DisplayEnd = ItemsFrozen + 1;
            StepNo = 1;
            return true;
        }

        // Already has item height (given by user in Begin): skip to calculating step
        DisplayStart = DisplayEnd;
        StepNo = 2;
    }

    // Step 1: the clipper infer height from first element
    if (StepNo == 1)
    {
        IM_ASSERT(ItemsHeight <= 0.0f);
        if (table)
        {
            const float pos_y1 = table->RowPosY1;   // Using this instead of StartPosY to handle clipper straddling the frozen row
            const float pos_y2 = table->RowPosY2;   // Using this instead of CursorPos.y to take account of tallest cell.
            ItemsHeight = pos_y2 - pos_y1;
            window->DC.CursorPos.y = pos_y2;
        }
        else
        {
            ItemsHeight = window->DC.CursorPos.y - StartPosY;
        }
        IM_ASSERT(ItemsHeight > 0.0f && "Unable to calculate item height! First item hasn't moved the cursor vertically!");
        StepNo = 2;
    }

    // Reached end of list
    if (DisplayEnd >= ItemsCount)
    {
        End();
        return false;
    }

    // Step 2: calculate the actual range of elements to display, and position the cursor before the first element
    if (StepNo == 2)
    {
        IM_ASSERT(ItemsHeight > 0.0f);

        int already_submitted = DisplayEnd;
        ImGui::CalcListClipping(ItemsCount - already_submitted, ItemsHeight, &DisplayStart, &DisplayEnd);
        DisplayStart += already_submitted;
        DisplayEnd += already_submitted;

        // Seek cursor
        if (DisplayStart > already_submitted)
            SetCursorPosYAndSetupForPrevLine(StartPosY + (DisplayStart - ItemsFrozen) * ItemsHeight, ItemsHeight);

        StepNo = 3;
        return true;
    }

    // Step 3: the clipper validate that we have reached the expected Y position (corresponding to element DisplayEnd),
    // Advance the cursor to the end of the list and then returns 'false' to end the loop.
    if (StepNo == 3)
    {
        // Seek cursor
        if (ItemsCount < INT_MAX)
            SetCursorPosYAndSetupForPrevLine(StartPosY + (ItemsCount - ItemsFrozen) * ItemsHeight, ItemsHeight); // advance cursor
        ItemsCount = -1;
        return false;
    }

    IM_ASSERT(0);
    return false;
}